

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>::ExtractSubrange
          (RepeatedPtrField<proto2_unittest::TestAllTypes> *this,int start,int num,
          TestAllTypes **elements)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  TestAllTypes ***v1;
  void **v2;
  Arena *pAVar5;
  TestAllTypes **ppTVar6;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_> *pVVar7;
  long lVar8;
  int local_cc;
  int i;
  TestAllTypes **extracted;
  Arena *arena;
  LogMessage local_a8;
  Voidify local_91;
  void *local_90;
  Nullable<const_char_*> local_88;
  Nullable<const_char_*> absl_log_internal_check_op_result_3;
  Voidify local_69;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  Voidify local_49;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_29;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestAllTypes **elements_local;
  int num_local;
  int start_local;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)elements;
  elements_local._0_4_ = num;
  elements_local._4_4_ = start;
  _num_local = this;
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue(start);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_28 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,iVar2,"start >= 0");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x596,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_1);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
  }
  iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue((int)elements_local);
  iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_48 = absl::lts_20250127::log_internal::Check_GEImpl(iVar1,iVar2,"num >= 0");
  if (local_48 == (Nullable<const_char_*>)0x0) {
    iVar1 = absl::lts_20250127::log_internal::GetReferenceableValue
                      (elements_local._4_4_ + (int)elements_local);
    iVar2 = size(this);
    iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar2);
    local_68 = absl::lts_20250127::log_internal::Check_LEImpl(iVar1,iVar2,"start + num <= size()");
    if (local_68 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_op_result_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x598,pcVar3);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                         ((LogMessage *)&absl_log_internal_check_op_result_3);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&absl_log_internal_check_op_result_3);
    }
    if ((int)elements_local != 0) {
      v1 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TestAllTypes**>
                     ((TestAllTypes ***)&absl_log_internal_check_op_result);
      local_90 = (void *)0x0;
      v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_90);
      local_88 = absl::lts_20250127::log_internal::
                 Check_NEImpl<proto2_unittest::TestAllTypes**,decltype(nullptr)>
                           (v1,v2,"elements != nullptr");
      if (local_88 != (Nullable<const_char_*>)0x0) {
        pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_88);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x59c,pcVar3);
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar4,(char (*) [107])
                                   "Releasing elements without transferring ownership is an unsafe operation.  Use UnsafeArenaExtractSubrange."
                           );
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      if (absl_log_internal_check_op_result != (Nullable<const_char_*>)0x0) {
        pAVar5 = GetArena(this);
        ppTVar6 = data(this);
        lVar8 = (long)elements_local._4_4_;
        if (pAVar5 == (Arena *)0x0) {
          memcpy(absl_log_internal_check_op_result,ppTVar6 + lVar8,(long)(int)elements_local << 3);
        }
        else {
          for (local_cc = 0; local_cc < (int)elements_local; local_cc = local_cc + 1) {
            pVVar7 = internal::RepeatedPtrFieldBase::
                     copy<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
                               ((ppTVar6 + lVar8)[local_cc]);
            *(Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>_>
              **)(absl_log_internal_check_op_result + (long)local_cc * 8) = pVVar7;
          }
        }
      }
      internal::RepeatedPtrFieldBase::CloseGap
                (&this->super_RepeatedPtrFieldBase,elements_local._4_4_,(int)elements_local);
    }
    return;
  }
  pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&absl_log_internal_check_op_result_2,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x597,pcVar3);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                     ((LogMessage *)&absl_log_internal_check_op_result_2);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&absl_log_internal_check_op_result_2);
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrange(int start, int num,
                                                       Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num == 0) return;

  ABSL_DCHECK_NE(elements, nullptr)
      << "Releasing elements without transferring ownership is an unsafe "
         "operation.  Use UnsafeArenaExtractSubrange.";
  if (elements != nullptr) {
    Arena* arena = GetArena();
    auto* extracted = data() + start;
    if (internal::DebugHardenForceCopyInRelease()) {
      // Always copy.
      for (int i = 0; i < num; ++i) {
        elements[i] = copy<TypeHandler>(extracted[i]);
      }
      if (arena == nullptr) {
        for (int i = 0; i < num; ++i) {
          delete extracted[i];
        }
      }
    } else {
      // If we're on an arena, we perform a copy for each element so that the
      // returned elements are heap-allocated. Otherwise, just forward it.
      if (arena != nullptr) {
        for (int i = 0; i < num; ++i) {
          elements[i] = copy<TypeHandler>(extracted[i]);
        }
      } else {
        memcpy(elements, extracted, num * sizeof(Element*));
      }
    }
  }
  CloseGap(start, num);
}